

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StructUnionMemberSyntax::StructUnionMemberSyntax
          (StructUnionMemberSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token randomQualifier,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  Token TVar1;
  bool bVar2;
  iterator ppAVar3;
  DataTypeSyntax *pDVar4;
  DeclaratorSyntax *pDVar5;
  DeclaratorSyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2_1;
  AttributeInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_38;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators_local;
  DataTypeSyntax *type_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  StructUnionMemberSyntax *this_local;
  Token randomQualifier_local;
  
  TVar1 = semi;
  randomQualifier_local._0_8_ = randomQualifier.info;
  this_local = randomQualifier._0_8_;
  local_38 = declarators;
  declarators_local = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)type;
  type_local = (DataTypeSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  SyntaxNode::SyntaxNode(&this->super_SyntaxNode,StructUnionMember);
  SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&this->attributes,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)type_local);
  *(StructUnionMemberSyntax **)&this->randomQualifier = this_local;
  (this->randomQualifier).info = (Info *)randomQualifier_local._0_8_;
  __range2 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)declarators_local;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&__range2);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
            (&this->declarators,local_38);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  __end2 = nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
           ::begin(&(this->attributes).
                    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>);
  ppAVar3 = nonstd::span_lite::
            span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::end
                      (&(this->attributes).
                        super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                      );
  for (; __end2 != ppAVar3; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  pDVar4 = not_null<slang::syntax::DataTypeSyntax_*>::operator->(&this->type);
  (pDVar4->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin(&this->declarators);
  _child_1 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(&this->declarators);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
                          *)&__end2_1.index,
                         (iterator_base<slang::syntax::DeclaratorSyntax_*> *)&child_1);
    if (!bVar2) break;
    pDVar5 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::operator*
                       ((iterator_base<slang::syntax::DeclaratorSyntax_*> *)&__end2_1.index);
    (pDVar5->super_SyntaxNode).parent = &this->super_SyntaxNode;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::DeclaratorSyntax_*,_unsigned_long,_slang::syntax::DeclaratorSyntax_**,_slang::syntax::DeclaratorSyntax_*&>
                  *)&__end2_1.index);
  }
  return;
}

Assistant:

StructUnionMemberSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token randomQualifier, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        SyntaxNode(SyntaxKind::StructUnionMember), attributes(attributes), randomQualifier(randomQualifier), type(&type), declarators(declarators), semi(semi) {
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }